

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

Node * __thiscall anon_unknown.dwarf_5f811d::Db::parseType(Db *this)

{
  char *pcVar1;
  Cache CVar2;
  char *pcVar3;
  Node *pNVar4;
  char *pcVar5;
  undefined **ppuVar6;
  Node *pNVar7;
  ArrayType *pAVar8;
  NameType *pNVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  char cVar13;
  int iVar14;
  Node NVar15;
  Node *Result;
  Node *Ty;
  StringView Dimension;
  ArrayType *local_40;
  Node *local_38;
  StringView local_30;
  
  local_40 = (ArrayType *)0x0;
  if (this->TypeCallback != (_func_void_void_ptr_char_ptr *)0x0) {
    (*this->TypeCallback)(this->TypeCallbackContext,this->First);
  }
  pcVar5 = this->First;
  pcVar3 = this->Last;
  uVar10 = (long)pcVar3 - (long)pcVar5;
  if (pcVar3 == pcVar5) goto switchD_001e3ff3_caseD_42;
  cVar13 = *pcVar5;
  switch(cVar13) {
  case 'A':
    pcVar1 = pcVar5 + 1;
    this->First = pcVar1;
    if (pcVar3 == pcVar1) {
LAB_001e4a6d:
      pNVar4 = parseExpr(this);
      if (((pNVar4 != (Node *)0x0) && (pcVar5 = this->First, pcVar5 != this->Last)) &&
         (*pcVar5 == '_')) {
        this->First = pcVar5 + 1;
        pNVar7 = parseType(this);
        if (pNVar7 != (Node *)0x0) {
          pAVar8 = (ArrayType *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
          (pAVar8->super_Node).K = KArrayType;
          (pAVar8->super_Node).RHSComponentCache = Yes;
          (pAVar8->super_Node).ArrayCache = Yes;
          (pAVar8->super_Node).FunctionCache = No;
          (pAVar8->super_Node)._vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00255ac0;
          pAVar8->Base = pNVar7;
          (pAVar8->Dimension).First = pNVar4;
          (pAVar8->Dimension).Second = (void *)0x0;
          goto LAB_001e48c4;
        }
      }
LAB_001e4ad8:
      pAVar8 = (ArrayType *)0x0;
    }
    else if ((int)*pcVar1 - 0x30U < 10) {
      pAVar8 = (ArrayType *)0x0;
      local_30 = parseNumber(this,false);
      pcVar5 = this->First;
      if (pcVar5 != this->Last) {
        if (*pcVar5 == '_') {
          this->First = pcVar5 + 1;
          local_38 = parseType(this);
          if (local_38 != (Node *)0x0) {
            pAVar8 = (anonymous_namespace)::Db::
                     make<(anonymous_namespace)::ArrayType,(anonymous_namespace)::Node*&,StringView&>
                               ((Db *)this,&local_38,&local_30);
            goto LAB_001e48c4;
          }
        }
        goto LAB_001e4ad8;
      }
    }
    else {
      if (*pcVar1 != '_') goto LAB_001e4a6d;
      this->First = pcVar5 + 2;
      pNVar4 = parseType(this);
      if (pNVar4 == (Node *)0x0) goto LAB_001e4ad8;
      pAVar8 = (ArrayType *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
      (pAVar8->super_Node).K = KArrayType;
      (pAVar8->super_Node).RHSComponentCache = Yes;
      (pAVar8->super_Node).ArrayCache = Yes;
      (pAVar8->super_Node).FunctionCache = No;
      (pAVar8->super_Node)._vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00255ac0;
      pAVar8->Base = pNVar4;
      (pAVar8->Dimension).First = (void *)0x0;
      (pAVar8->Dimension).Second = (void *)0x0;
    }
    goto LAB_001e48c4;
  default:
    goto switchD_001e3ff3_caseD_42;
  case 'C':
    this->First = pcVar5 + 1;
    pNVar4 = parseType(this);
    if (pNVar4 == (Node *)0x0) {
      return (Node *)0x0;
    }
    local_40 = (ArrayType *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
    (local_40->super_Node).K = KPostfixQualifiedType;
    (local_40->super_Node).RHSComponentCache = No;
    (local_40->super_Node).ArrayCache = No;
    (local_40->super_Node).FunctionCache = No;
    (local_40->super_Node)._vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00255c78;
    local_40->Base = pNVar4;
    (local_40->Dimension).First = " complex";
    pcVar5 = "";
    goto LAB_001e452e;
  case 'D':
    if (uVar10 < 2) {
      return (Node *)0x0;
    }
    pNVar4 = (Node *)0x0;
    switch(pcVar5[1]) {
    case 'O':
    case 'o':
    case 'w':
    case 'x':
      goto switchD_001e3ff3_caseD_46;
    default:
      goto switchD_001e46b7_caseD_50;
    case 'T':
    case 't':
      pAVar8 = (ArrayType *)parseDecltype(this);
      goto LAB_001e48c4;
    case 'a':
      this->First = pcVar5 + 2;
      pNVar9 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[5]>
                         ((Db *)this,(char (*) [5])"auto");
      return &pNVar9->super_Node;
    case 'c':
      this->First = pcVar5 + 2;
      pcVar5 = "decltype(auto)";
      goto LAB_001e4cae;
    case 'd':
      this->First = pcVar5 + 2;
      pcVar5 = "decimal64";
      break;
    case 'e':
      this->First = pcVar5 + 2;
      pNVar9 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[11]>
                         ((Db *)this,(char (*) [11])"decimal128");
      return &pNVar9->super_Node;
    case 'f':
      this->First = pcVar5 + 2;
      pcVar5 = "decimal32";
      break;
    case 'h':
      this->First = pcVar5 + 2;
      pcVar5 = "decimal16";
      break;
    case 'i':
      this->First = pcVar5 + 2;
      pcVar5 = "char32_t";
      goto LAB_001e4c5f;
    case 'n':
      this->First = pcVar5 + 2;
      pcVar5 = "std::nullptr_t";
LAB_001e4cae:
      pNVar9 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[15]>
                         ((Db *)this,(char (*) [15])pcVar5);
      return &pNVar9->super_Node;
    case 'p':
      this->First = pcVar5 + 2;
      pNVar4 = parseType(this);
      if (pNVar4 == (Node *)0x0) {
        return (Node *)0x0;
      }
      local_40 = (ArrayType *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x18);
      (local_40->super_Node).K = KParameterPackExpansion;
      (local_40->super_Node).RHSComponentCache = No;
      (local_40->super_Node).ArrayCache = No;
      (local_40->super_Node).FunctionCache = No;
      ppuVar6 = &PTR_hasRHSComponentSlow_00254a98;
      goto LAB_001e4754;
    case 's':
      this->First = pcVar5 + 2;
      pcVar5 = "char16_t";
LAB_001e4c5f:
      pNVar9 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[9]>
                         ((Db *)this,(char (*) [9])pcVar5);
      return &pNVar9->super_Node;
    case 'v':
      pAVar8 = (ArrayType *)parseVectorType(this);
      goto LAB_001e48c4;
    }
    pNVar9 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[10]>
                       ((Db *)this,(char (*) [10])pcVar5);
    return &pNVar9->super_Node;
  case 'F':
    goto switchD_001e3ff3_caseD_46;
  case 'G':
    this->First = pcVar5 + 1;
    pNVar4 = parseType(this);
    if (pNVar4 == (Node *)0x0) {
      return (Node *)0x0;
    }
    local_40 = (ArrayType *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
    (local_40->super_Node).K = KPostfixQualifiedType;
    (local_40->super_Node).RHSComponentCache = No;
    (local_40->super_Node).ArrayCache = No;
    (local_40->super_Node).FunctionCache = No;
    (local_40->super_Node)._vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00255c78;
    local_40->Base = pNVar4;
    (local_40->Dimension).First = " imaginary";
    pcVar5 = "";
LAB_001e452e:
    (local_40->Dimension).Second = pcVar5;
    goto LAB_001e48cd;
  case 'K':
  case 'V':
    iVar14 = 0;
LAB_001e43ce:
    uVar12 = (ulong)((uint)(cVar13 == 'V') + iVar14);
    goto LAB_001e43d9;
  case 'M':
    this->First = pcVar5 + 1;
    pNVar4 = parseType(this);
    if ((pNVar4 == (Node *)0x0) || (pNVar7 = parseType(this), pNVar7 == (Node *)0x0))
    goto LAB_001e4ad8;
    pAVar8 = (ArrayType *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
    CVar2 = pNVar7->RHSComponentCache;
    (pAVar8->super_Node).K = KPointerToMemberType;
    (pAVar8->super_Node).RHSComponentCache = CVar2;
    (pAVar8->super_Node).ArrayCache = No;
    (pAVar8->super_Node).FunctionCache = No;
    (pAVar8->super_Node)._vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00255b18;
    pAVar8->Base = pNVar4;
    (pAVar8->Dimension).First = pNVar7;
    goto LAB_001e48c4;
  case 'O':
    this->First = pcVar5 + 1;
    pNVar4 = parseType(this);
    if (pNVar4 == (Node *)0x0) {
      return (Node *)0x0;
    }
    local_40 = (ArrayType *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
    CVar2 = pNVar4->RHSComponentCache;
    (local_40->super_Node).K = KReferenceType;
    (local_40->super_Node).RHSComponentCache = CVar2;
    (local_40->super_Node).ArrayCache = No;
    (local_40->super_Node).FunctionCache = No;
    (local_40->super_Node)._vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00255c20;
    local_40->Base = pNVar4;
    *(undefined4 *)&(local_40->Dimension).First = 1;
    goto LAB_001e493e;
  case 'P':
    this->First = pcVar5 + 1;
    pNVar4 = parseType(this);
    if (pNVar4 == (Node *)0x0) {
      return (Node *)0x0;
    }
    local_40 = (ArrayType *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x18);
    CVar2 = pNVar4->RHSComponentCache;
    (local_40->super_Node).K = KPointerType;
    (local_40->super_Node).RHSComponentCache = CVar2;
    (local_40->super_Node).ArrayCache = No;
    (local_40->super_Node).FunctionCache = No;
    ppuVar6 = &PTR_hasRHSComponentSlow_00255bc8;
LAB_001e4754:
    (local_40->super_Node)._vptr_Node = (_func_int **)ppuVar6;
    local_40->Base = pNVar4;
    goto LAB_001e48cd;
  case 'R':
    this->First = pcVar5 + 1;
    pNVar4 = parseType(this);
    if (pNVar4 == (Node *)0x0) {
      return (Node *)0x0;
    }
    local_40 = (ArrayType *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
    CVar2 = pNVar4->RHSComponentCache;
    (local_40->super_Node).K = KReferenceType;
    (local_40->super_Node).RHSComponentCache = CVar2;
    (local_40->super_Node).ArrayCache = No;
    (local_40->super_Node).FunctionCache = No;
    (local_40->super_Node)._vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00255c20;
    local_40->Base = pNVar4;
    *(undefined4 *)&(local_40->Dimension).First = 0;
LAB_001e493e:
    *(undefined1 *)((long)&(local_40->Dimension).First + 4) = 0;
    goto LAB_001e48cd;
  case 'S':
    if (((1 < uVar10) && (pcVar5[1] != '\0')) && (pcVar5[1] != 't')) {
      pAVar8 = (ArrayType *)parseSubstitution(this);
      if (pAVar8 == (ArrayType *)0x0) {
        return (Node *)0x0;
      }
      if (this->TryToParseTemplateArgs != true) {
        return &pAVar8->super_Node;
      }
      if (this->Last == this->First) {
        return &pAVar8->super_Node;
      }
      if (*this->First != 'I') {
        return &pAVar8->super_Node;
      }
LAB_001e4b1c:
      pNVar4 = parseTemplateArgs(this,false);
      if (pNVar4 == (Node *)0x0) {
        return (Node *)0x0;
      }
      local_40 = (ArrayType *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
      (local_40->super_Node).K = KNameWithTemplateArgs;
      (local_40->super_Node).RHSComponentCache = No;
      (local_40->super_Node).ArrayCache = No;
      (local_40->super_Node).FunctionCache = No;
      (local_40->super_Node)._vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00255648;
      local_40->Base = &pAVar8->super_Node;
      (local_40->Dimension).First = pNVar4;
      goto LAB_001e48cd;
    }
    goto switchD_001e3ff3_caseD_42;
  case 'T':
    if (((uVar10 < 2) || (0x10 < (byte)pcVar5[1] - 0x65)) ||
       ((0x14001U >> ((byte)pcVar5[1] - 0x65 & 0x1f) & 1) == 0)) {
      pAVar8 = (ArrayType *)parseTemplateParam(this);
      if (pAVar8 == (ArrayType *)0x0) {
        return (Node *)0x0;
      }
      local_40 = pAVar8;
      if (((this->TryToParseTemplateArgs != true) || (this->Last == this->First)) ||
         (*this->First != 'I')) goto LAB_001e48cd;
      goto LAB_001e4b1c;
    }
switchD_001e3ff3_caseD_42:
    pAVar8 = (ArrayType *)parseClassEnumType(this);
    goto LAB_001e48c4;
  case 'U':
    goto switchD_001e3ff3_caseD_55;
  case 'a':
    this->First = pcVar5 + 1;
    pNVar4 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
    pNVar4->K = KNameType;
    pNVar4->RHSComponentCache = No;
    pNVar4->ArrayCache = No;
    pNVar4->FunctionCache = No;
    pNVar4->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_002546d0;
    pNVar4[1]._vptr_Node = (_func_int **)0x215788;
    pcVar5 = "";
    break;
  case 'b':
    this->First = pcVar5 + 1;
    pNVar4 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
    pNVar4->K = KNameType;
    pNVar4->RHSComponentCache = No;
    pNVar4->ArrayCache = No;
    pNVar4->FunctionCache = No;
    pNVar4->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_002546d0;
    pNVar4[1]._vptr_Node = (_func_int **)"bool";
    pcVar5 = "";
    break;
  case 'c':
    this->First = pcVar5 + 1;
    pNVar4 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
    pNVar4->K = KNameType;
    pNVar4->RHSComponentCache = No;
    pNVar4->ArrayCache = No;
    pNVar4->FunctionCache = No;
    pNVar4->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_002546d0;
    pNVar4[1]._vptr_Node = (_func_int **)0x21578f;
    pcVar5 = "";
    break;
  case 'd':
    this->First = pcVar5 + 1;
    pNVar4 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
    pNVar4->K = KNameType;
    pNVar4->RHSComponentCache = No;
    pNVar4->ArrayCache = No;
    pNVar4->FunctionCache = No;
    pNVar4->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_002546d0;
    pNVar4[1]._vptr_Node = (_func_int **)0x215e0e;
    pcVar5 = "";
    break;
  case 'e':
    this->First = pcVar5 + 1;
    pNVar4 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
    pNVar4->K = KNameType;
    pNVar4->RHSComponentCache = No;
    pNVar4->ArrayCache = No;
    pNVar4->FunctionCache = No;
    pNVar4->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_002546d0;
    pNVar4[1]._vptr_Node = (_func_int **)"long double";
    pcVar5 = "";
    break;
  case 'f':
    this->First = pcVar5 + 1;
    pNVar4 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
    pNVar4->K = KNameType;
    pNVar4->RHSComponentCache = No;
    pNVar4->ArrayCache = No;
    pNVar4->FunctionCache = No;
    pNVar4->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_002546d0;
    pNVar4[1]._vptr_Node = (_func_int **)"float";
    pcVar5 = "";
    break;
  case 'g':
    this->First = pcVar5 + 1;
    pNVar4 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
    pNVar4->K = KNameType;
    pNVar4->RHSComponentCache = No;
    pNVar4->ArrayCache = No;
    pNVar4->FunctionCache = No;
    pNVar4->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_002546d0;
    pNVar4[1]._vptr_Node = (_func_int **)"__float128";
    pcVar5 = "";
    break;
  case 'h':
    this->First = pcVar5 + 1;
    pNVar4 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
    pNVar4->K = KNameType;
    pNVar4->RHSComponentCache = No;
    pNVar4->ArrayCache = No;
    pNVar4->FunctionCache = No;
    pNVar4->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_002546d0;
    pNVar4[1]._vptr_Node = (_func_int **)"unsigned char";
    pcVar5 = "";
    break;
  case 'i':
    this->First = pcVar5 + 1;
    pNVar4 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
    pNVar4->K = KNameType;
    pNVar4->RHSComponentCache = No;
    pNVar4->ArrayCache = No;
    pNVar4->FunctionCache = No;
    pNVar4->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_002546d0;
    pNVar4[1]._vptr_Node = (_func_int **)0x215dde;
    pcVar5 = "";
    break;
  case 'j':
    this->First = pcVar5 + 1;
    pNVar4 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
    pNVar4->K = KNameType;
    pNVar4->RHSComponentCache = No;
    pNVar4->ArrayCache = No;
    pNVar4->FunctionCache = No;
    pNVar4->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_002546d0;
    pNVar4[1]._vptr_Node = (_func_int **)"unsigned int";
    pcVar5 = "";
    break;
  case 'l':
    this->First = pcVar5 + 1;
    pNVar4 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
    pNVar4->K = KNameType;
    pNVar4->RHSComponentCache = No;
    pNVar4->ArrayCache = No;
    pNVar4->FunctionCache = No;
    pNVar4->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_002546d0;
    pNVar4[1]._vptr_Node = (_func_int **)0x215deb;
    pcVar5 = "";
    break;
  case 'm':
    this->First = pcVar5 + 1;
    pNVar4 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
    pNVar4->K = KNameType;
    pNVar4->RHSComponentCache = No;
    pNVar4->ArrayCache = No;
    pNVar4->FunctionCache = No;
    pNVar4->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_002546d0;
    pNVar4[1]._vptr_Node = (_func_int **)"unsigned long";
    pcVar5 = "";
    break;
  case 'n':
    this->First = pcVar5 + 1;
    pNVar4 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
    pNVar4->K = KNameType;
    pNVar4->RHSComponentCache = No;
    pNVar4->ArrayCache = No;
    pNVar4->FunctionCache = No;
    pNVar4->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_002546d0;
    pNVar4[1]._vptr_Node = (_func_int **)0x2157ac;
    pcVar5 = "";
    break;
  case 'o':
    this->First = pcVar5 + 1;
    pNVar4 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
    pNVar4->K = KNameType;
    pNVar4->RHSComponentCache = No;
    pNVar4->ArrayCache = No;
    pNVar4->FunctionCache = No;
    pNVar4->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_002546d0;
    pNVar4[1]._vptr_Node = (_func_int **)"unsigned __int128";
    pcVar5 = "";
    break;
  case 'r':
    uVar12 = 1;
    if (1 < uVar10) {
      cVar13 = pcVar5[1];
      iVar14 = 1;
      goto LAB_001e43ce;
    }
LAB_001e43d9:
    uVar11 = (uint)uVar12;
    if (uVar12 < uVar10) {
      uVar11 = uVar11 + (pcVar5[uVar12] == 'K');
      uVar12 = (ulong)uVar11;
    }
    if ((uVar12 < uVar10) &&
       ((pcVar5[uVar12] == 'F' ||
        ((((pcVar5[uVar12] == 'D' && ((ulong)uVar11 + 1 < uVar10)) &&
          ((byte)pcVar5[(ulong)uVar11 + 1] - 0x4f < 0x2a)) &&
         ((0x30100000001U >> ((ulong)((byte)pcVar5[(ulong)uVar11 + 1] - 0x4f) & 0x3f) & 1) != 0)))))
       ) {
switchD_001e3ff3_caseD_46:
      pAVar8 = (ArrayType *)parseFunctionType(this);
    }
    else {
switchD_001e3ff3_caseD_55:
      pAVar8 = (ArrayType *)parseQualifiedType(this);
    }
LAB_001e48c4:
    local_40 = pAVar8;
    if (pAVar8 == (ArrayType *)0x0) {
      return (Node *)0x0;
    }
LAB_001e48cd:
    pAVar8 = local_40;
    PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(&this->Subs,(Node **)&local_40);
    return &pAVar8->super_Node;
  case 's':
    this->First = pcVar5 + 1;
    pNVar4 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
    pNVar4->K = KNameType;
    pNVar4->RHSComponentCache = No;
    pNVar4->ArrayCache = No;
    pNVar4->FunctionCache = No;
    pNVar4->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_002546d0;
    pNVar4[1]._vptr_Node = (_func_int **)0x21579d;
    pcVar5 = "";
    break;
  case 't':
    this->First = pcVar5 + 1;
    pNVar4 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
    pNVar4->K = KNameType;
    pNVar4->RHSComponentCache = No;
    pNVar4->ArrayCache = No;
    pNVar4->FunctionCache = No;
    pNVar4->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_002546d0;
    pNVar4[1]._vptr_Node = (_func_int **)"unsigned short";
    pcVar5 = "";
    break;
  case 'u':
    this->First = pcVar5 + 1;
    NVar15 = (Node)parseBareSourceName(this);
    if (NVar15._vptr_Node == NVar15._8_8_) {
      return (Node *)0x0;
    }
    pNVar4 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
    pNVar4->K = KNameType;
    pNVar4->RHSComponentCache = No;
    pNVar4->ArrayCache = No;
    pNVar4->FunctionCache = No;
    pNVar4->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_002546d0;
    pNVar4[1] = NVar15;
    return pNVar4;
  case 'v':
    this->First = pcVar5 + 1;
    pNVar4 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
    pNVar4->K = KNameType;
    pNVar4->RHSComponentCache = No;
    pNVar4->ArrayCache = No;
    pNVar4->FunctionCache = No;
    pNVar4->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_002546d0;
    pNVar4[1]._vptr_Node = (_func_int **)"void";
    pcVar5 = "";
    break;
  case 'w':
    this->First = pcVar5 + 1;
    pNVar4 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
    pNVar4->K = KNameType;
    pNVar4->RHSComponentCache = No;
    pNVar4->ArrayCache = No;
    pNVar4->FunctionCache = No;
    pNVar4->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_002546d0;
    pNVar4[1]._vptr_Node = (_func_int **)"wchar_t";
    pcVar5 = "";
    break;
  case 'x':
    this->First = pcVar5 + 1;
    pNVar4 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
    pNVar4->K = KNameType;
    pNVar4->RHSComponentCache = No;
    pNVar4->ArrayCache = No;
    pNVar4->FunctionCache = No;
    pNVar4->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_002546d0;
    pNVar4[1]._vptr_Node = (_func_int **)0x215df9;
    pcVar5 = "";
    break;
  case 'y':
    this->First = pcVar5 + 1;
    pNVar4 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
    pNVar4->K = KNameType;
    pNVar4->RHSComponentCache = No;
    pNVar4->ArrayCache = No;
    pNVar4->FunctionCache = No;
    pNVar4->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_002546d0;
    pNVar4[1]._vptr_Node = (_func_int **)"unsigned long long";
    pcVar5 = "";
    break;
  case 'z':
    this->First = pcVar5 + 1;
    pNVar4 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
    pNVar4->K = KNameType;
    pNVar4->RHSComponentCache = No;
    pNVar4->ArrayCache = No;
    pNVar4->FunctionCache = No;
    pNVar4->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_002546d0;
    pNVar4[1]._vptr_Node = (_func_int **)0x1f795d;
    pcVar5 = "";
  }
  *(char **)&pNVar4[1].K = pcVar5;
switchD_001e46b7_caseD_50:
  return pNVar4;
}

Assistant:

Node *Db::parseType() {
  Node *Result = nullptr;

  if (TypeCallback != nullptr)
    TypeCallback(TypeCallbackContext, First);

  switch (look()) {
  //             ::= <qualified-type>
  case 'r':
  case 'V':
  case 'K': {
    unsigned AfterQuals = 0;
    if (look(AfterQuals) == 'r') ++AfterQuals;
    if (look(AfterQuals) == 'V') ++AfterQuals;
    if (look(AfterQuals) == 'K') ++AfterQuals;

    if (look(AfterQuals) == 'F' ||
        (look(AfterQuals) == 'D' &&
         (look(AfterQuals + 1) == 'o' || look(AfterQuals + 1) == 'O' ||
          look(AfterQuals + 1) == 'w' || look(AfterQuals + 1) == 'x'))) {
      Result = parseFunctionType();
      break;
    }
    LLVM_FALLTHROUGH;
  }
  case 'U': {
    Result = parseQualifiedType();
    break;
  }
  // <builtin-type> ::= v    # void
  case 'v':
    ++First;
    return make<NameType>("void");
  //                ::= w    # wchar_t
  case 'w':
    ++First;
    return make<NameType>("wchar_t");
  //                ::= b    # bool
  case 'b':
    ++First;
    return make<NameType>("bool");
  //                ::= c    # char
  case 'c':
    ++First;
    return make<NameType>("char");
  //                ::= a    # signed char
  case 'a':
    ++First;
    return make<NameType>("signed char");
  //                ::= h    # unsigned char
  case 'h':
    ++First;
    return make<NameType>("unsigned char");
  //                ::= s    # short
  case 's':
    ++First;
    return make<NameType>("short");
  //                ::= t    # unsigned short
  case 't':
    ++First;
    return make<NameType>("unsigned short");
  //                ::= i    # int
  case 'i':
    ++First;
    return make<NameType>("int");
  //                ::= j    # unsigned int
  case 'j':
    ++First;
    return make<NameType>("unsigned int");
  //                ::= l    # long
  case 'l':
    ++First;
    return make<NameType>("long");
  //                ::= m    # unsigned long
  case 'm':
    ++First;
    return make<NameType>("unsigned long");
  //                ::= x    # long long, __int64
  case 'x':
    ++First;
    return make<NameType>("long long");
  //                ::= y    # unsigned long long, __int64
  case 'y':
    ++First;
    return make<NameType>("unsigned long long");
  //                ::= n    # __int128
  case 'n':
    ++First;
    return make<NameType>("__int128");
  //                ::= o    # unsigned __int128
  case 'o':
    ++First;
    return make<NameType>("unsigned __int128");
  //                ::= f    # float
  case 'f':
    ++First;
    return make<NameType>("float");
  //                ::= d    # double
  case 'd':
    ++First;
    return make<NameType>("double");
  //                ::= e    # long double, __float80
  case 'e':
    ++First;
    return make<NameType>("long double");
  //                ::= g    # __float128
  case 'g':
    ++First;
    return make<NameType>("__float128");
  //                ::= z    # ellipsis
  case 'z':
    ++First;
    return make<NameType>("...");

  // <builtin-type> ::= u <source-name>    # vendor extended type
  case 'u': {
    ++First;
    StringView Res = parseBareSourceName();
    if (Res.empty())
      return nullptr;
    return make<NameType>(Res);
  }
  case 'D':
    switch (look(1)) {
    //                ::= Dd   # IEEE 754r decimal floating point (64 bits)
    case 'd':
      First += 2;
      return make<NameType>("decimal64");
    //                ::= De   # IEEE 754r decimal floating point (128 bits)
    case 'e':
      First += 2;
      return make<NameType>("decimal128");
    //                ::= Df   # IEEE 754r decimal floating point (32 bits)
    case 'f':
      First += 2;
      return make<NameType>("decimal32");
    //                ::= Dh   # IEEE 754r half-precision floating point (16 bits)
    case 'h':
      First += 2;
      return make<NameType>("decimal16");
    //                ::= Di   # char32_t
    case 'i':
      First += 2;
      return make<NameType>("char32_t");
    //                ::= Ds   # char16_t
    case 's':
      First += 2;
      return make<NameType>("char16_t");
    //                ::= Da   # auto (in dependent new-expressions)
    case 'a':
      First += 2;
      return make<NameType>("auto");
    //                ::= Dc   # decltype(auto)
    case 'c':
      First += 2;
      return make<NameType>("decltype(auto)");
    //                ::= Dn   # std::nullptr_t (i.e., decltype(nullptr))
    case 'n':
      First += 2;
      return make<NameType>("std::nullptr_t");

    //             ::= <decltype>
    case 't':
    case 'T': {
      Result = parseDecltype();
      break;
    }
    // extension   ::= <vector-type> # <vector-type> starts with Dv
    case 'v': {
      Result = parseVectorType();
      break;
    }
    //           ::= Dp <type>       # pack expansion (C++0x)
    case 'p': {
      First += 2;
      Node *Child = parseType();
      if (!Child)
        return nullptr;
      Result = make<ParameterPackExpansion>(Child);
      break;
    }
    // Exception specifier on a function type.
    case 'o':
    case 'O':
    case 'w':
    // Transaction safe function type.
    case 'x':
      Result = parseFunctionType();
      break;
    }
    break;
  //             ::= <function-type>
  case 'F': {
    Result = parseFunctionType();
    break;
  }
  //             ::= <array-type>
  case 'A': {
    Result = parseArrayType();
    break;
  }
  //             ::= <pointer-to-member-type>
  case 'M': {
    Result = parsePointerToMemberType();
    break;
  }
  //             ::= <template-param>
  case 'T': {
    // This could be an elaborate type specifier on a <class-enum-type>.
    if (look(1) == 's' || look(1) == 'u' || look(1) == 'e') {
      Result = parseClassEnumType();
      break;
    }

    Result = parseTemplateParam();
    if (Result == nullptr)
      return nullptr;

    // Result could be either of:
    //   <type>        ::= <template-param>
    //   <type>        ::= <template-template-param> <template-args>
    //
    //   <template-template-param> ::= <template-param>
    //                             ::= <substitution>
    //
    // If this is followed by some <template-args>, and we're permitted to
    // parse them, take the second production.

    if (TryToParseTemplateArgs && look() == 'I') {
      Node *TA = parseTemplateArgs();
      if (TA == nullptr)
        return nullptr;
      Result = make<NameWithTemplateArgs>(Result, TA);
    }
    break;
  }
  //             ::= P <type>        # pointer
  case 'P': {
    ++First;
    Node *Ptr = parseType();
    if (Ptr == nullptr)
      return nullptr;
    Result = make<PointerType>(Ptr);
    break;
  }
  //             ::= R <type>        # l-value reference
  case 'R': {
    ++First;
    Node *Ref = parseType();
    if (Ref == nullptr)
      return nullptr;
    Result = make<ReferenceType>(Ref, ReferenceKind::LValue);
    break;
  }
  //             ::= O <type>        # r-value reference (C++11)
  case 'O': {
    ++First;
    Node *Ref = parseType();
    if (Ref == nullptr)
      return nullptr;
    Result = make<ReferenceType>(Ref, ReferenceKind::RValue);
    break;
  }
  //             ::= C <type>        # complex pair (C99)
  case 'C': {
    ++First;
    Node *P = parseType();
    if (P == nullptr)
      return nullptr;
    Result = make<PostfixQualifiedType>(P, " complex");
    break;
  }
  //             ::= G <type>        # imaginary (C99)
  case 'G': {
    ++First;
    Node *P = parseType();
    if (P == nullptr)
      return P;
    Result = make<PostfixQualifiedType>(P, " imaginary");
    break;
  }
  //             ::= <substitution>  # See Compression below
  case 'S': {
    if (look(1) && look(1) != 't') {
      Node *Sub = parseSubstitution();
      if (Sub == nullptr)
        return nullptr;

      // Sub could be either of:
      //   <type>        ::= <substitution>
      //   <type>        ::= <template-template-param> <template-args>
      //
      //   <template-template-param> ::= <template-param>
      //                             ::= <substitution>
      //
      // If this is followed by some <template-args>, and we're permitted to
      // parse them, take the second production.

      if (TryToParseTemplateArgs && look() == 'I') {
        Node *TA = parseTemplateArgs();
        if (TA == nullptr)
          return nullptr;
        Result = make<NameWithTemplateArgs>(Sub, TA);
        break;
      }

      // If all we parsed was a substitution, don't re-insert into the
      // substitution table.
      return Sub;
    }
    LLVM_FALLTHROUGH;
  }
  //        ::= <class-enum-type>
  default: {
    Result = parseClassEnumType();
    break;
  }
  }

  // If we parsed a type, insert it into the substitution table. Note that all
  // <builtin-type>s and <substitution>s have already bailed out, because they
  // don't get substitutions.
  if (Result != nullptr)
    Subs.push_back(Result);
  return Result;
}